

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O3

void framebuffer_size_callback(GLFWwindow *window,int width,int height)

{
  double dVar1;
  
  dVar1 = 1.0;
  if (0 < height) {
    dVar1 = (double)((float)width / (float)height);
  }
  glViewport(0,0);
  glMatrixMode(0x1701);
  glLoadIdentity();
  gluPerspective(0x404e000000000000,dVar1,0x3ff0000000000000,0x4090000000000000);
  return;
}

Assistant:

void framebuffer_size_callback(GLFWwindow* window, int width, int height)
{
    float ratio = 1.f;

    if (height > 0)
        ratio = (float) width / (float) height;

    // Setup viewport
    glViewport(0, 0, width, height);

    // Change to the projection matrix and set our viewing volume
    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    gluPerspective(60.0, ratio, 1.0, 1024.0);
}